

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O0

Value __thiscall jbcoin::STLedgerEntry::getJson(STLedgerEntry *this,int options)

{
  Value *this_00;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  Value VVar1;
  string local_50;
  Value local_30;
  undefined1 local_1d;
  long lStack_18;
  int options_local;
  STLedgerEntry *this_local;
  Value *ret;
  
  local_1d = 0;
  lStack_18 = CONCAT44(in_register_00000034,options);
  this_local = this;
  VVar1 = STObject::getJson(&this->super_STObject,options);
  to_string<256ul,void>
            (&local_50,(jbcoin *)(CONCAT44(in_register_00000034,options) + 0x30),VVar1._8_8_);
  Json::Value::Value(&local_30,&local_50);
  this_00 = Json::Value::operator[]((Value *)this,(StaticString *)&jss::index);
  Json::Value::operator=(this_00,&local_30);
  Json::Value::~Value(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  VVar1._8_8_ = extraout_RDX;
  VVar1.value_.map_ = (ObjectValues *)this;
  return VVar1;
}

Assistant:

Json::Value STLedgerEntry::getJson (int options) const
{
    Json::Value ret (STObject::getJson (options));

    ret[jss::index] = to_string (key_);

    return ret;
}